

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall
ON_SubDVertex::CreasedEdgeCount
          (ON_SubDVertex *this,bool bCountInteriorCreases,bool bCountBoundaryCreases,
          bool bCountNonmanifoldCreases,bool bCountWireCreases)

{
  short sVar1;
  ulong uVar2;
  ON_SubDEdge *e;
  uint local_18;
  unsigned_short vei;
  uint creased_edge_count;
  bool bCountWireCreases_local;
  bool bCountNonmanifoldCreases_local;
  bool bCountBoundaryCreases_local;
  bool bCountInteriorCreases_local;
  ON_SubDVertex *this_local;
  
  local_18 = 0;
  for (e._6_2_ = 0; e._6_2_ < this->m_edge_count; e._6_2_ = e._6_2_ + 1) {
    uVar2 = this->m_edges[e._6_2_].m_ptr & 0xfffffffffffffff8;
    if ((uVar2 != 0) && (*(char *)(uVar2 + 0x60) == '\x02')) {
      sVar1 = *(short *)(uVar2 + 100);
      if (sVar1 == 0) {
        if (bCountWireCreases) {
          local_18 = local_18 + 1;
        }
      }
      else if (sVar1 == 1) {
        if (bCountBoundaryCreases) {
          local_18 = local_18 + 1;
        }
      }
      else if (sVar1 == 2) {
        if (bCountInteriorCreases) {
          local_18 = local_18 + 1;
        }
      }
      else if (bCountNonmanifoldCreases) {
        local_18 = local_18 + 1;
      }
    }
  }
  return local_18;
}

Assistant:

const unsigned int ON_SubDVertex::CreasedEdgeCount(
  bool bCountInteriorCreases, 
  bool bCountBoundaryCreases, 
  bool bCountNonmanifoldCreases,
  bool bCountWireCreases
) const
{
  unsigned creased_edge_count = 0;
  for (unsigned short vei = 0; vei < m_edge_count; ++vei)
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
    if (nullptr == e)
      continue;
    if (ON_SubDEdgeTag::Crease != e->m_edge_tag)
      continue;
    switch (e->m_face_count)
    {
    case 0:
      if (bCountWireCreases)
        ++creased_edge_count;
      break;
    case 1:
      if (bCountBoundaryCreases)
        ++creased_edge_count;
      break;
    case 2:
      if (bCountInteriorCreases)
        ++creased_edge_count;
      break;
    default:
      if (bCountNonmanifoldCreases)
        ++creased_edge_count;
      break;
    }
  }
  return creased_edge_count;
}